

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O2

BorderAmounts * __thiscall
CoreML::Specification::PaddingLayerParams::_internal_mutable_paddingamounts
          (PaddingLayerParams *this)

{
  ulong uVar1;
  BorderAmounts *pBVar2;
  Arena *arena;
  
  if (this->paddingamounts_ != (BorderAmounts *)0x0) {
    return this->paddingamounts_;
  }
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    arena = *(Arena **)arena;
  }
  pBVar2 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::BorderAmounts>(arena);
  this->paddingamounts_ = pBVar2;
  return pBVar2;
}

Assistant:

inline ::CoreML::Specification::BorderAmounts* PaddingLayerParams::_internal_mutable_paddingamounts() {
  
  if (paddingamounts_ == nullptr) {
    auto* p = CreateMaybeMessage<::CoreML::Specification::BorderAmounts>(GetArenaForAllocation());
    paddingamounts_ = p;
  }
  return paddingamounts_;
}